

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  float fVar4;
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImU32 local_9c;
  float local_98;
  ImU32 cross_col;
  float cross_extent;
  ImVec2 center;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool is_clipped;
  ImVec2 local_7c;
  ImVec2 local_74;
  float local_6c;
  undefined1 auStack_68 [4];
  float area_to_visible_ratio;
  ImRect bb_interact;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *pos_local;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  bb.Max = (ImVec2)GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_50,GImGui->FontSize,GImGui->FontSize);
  local_48 = operator+(pos,&local_50);
  bb_interact.Max = operator*(&(pIVar2->Style).FramePadding,2.0);
  local_40 = operator+(&local_48,&bb_interact.Max);
  ImRect::ImRect((ImRect *)local_38,pos,&local_40);
  auStack_68 = (undefined1  [4])local_38._0_4_;
  area_to_visible_ratio = (float)local_38._4_4_;
  bb_interact.Min = bb.Min;
  fVar4 = ImRect::GetArea((ImRect *)((long)bb.Max + 0x200));
  local_6c = ImRect::GetArea((ImRect *)local_38);
  local_6c = fVar4 / local_6c;
  if (local_6c < 1.5) {
    _col = ImRect::GetSize((ImRect *)auStack_68);
    local_7c = operator*((ImVec2 *)&col,-0.25);
    local_74 = ImFloor(&local_7c);
    ImRect::Expand((ImRect *)auStack_68,&local_74);
  }
  bVar3 = ItemAdd((ImRect *)auStack_68,id,(ImRect *)0x0,0);
  center.y._3_1_ = (bVar3 ^ 0xffU) & 1;
  center.y._0_1_ =
       ButtonBehavior((ImRect *)auStack_68,id,(bool *)((long)&center.y + 2),
                      (bool *)((long)&center.y + 1),0);
  pos_local._7_1_ = (bool)center.y._0_1_;
  if ((center.y._3_1_ & 1) == 0) {
    center.x = (float)GetColorU32(center.y._1_1_ & 1 | 0x16,1.0);
    _cross_col = ImRect::GetCenter((ImRect *)local_38);
    if ((center.y._2_1_ & 1) != 0) {
      pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
      fVar4 = ImMax<float>(2.0,pIVar2->FontSize * 0.5 + 1.0);
      ImDrawList::AddCircleFilled(pIVar1,(ImVec2 *)&cross_col,fVar4,(ImU32)center.x,0xc);
    }
    local_98 = pIVar2->FontSize * 0.5 * 0.7071 + -1.0;
    local_9c = GetColorU32(0,1.0);
    ImVec2::ImVec2(&local_a4,0.5,0.5);
    operator-=((ImVec2 *)&cross_col,&local_a4);
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
    ImVec2::ImVec2(&local_b4,local_98,local_98);
    local_ac = operator+((ImVec2 *)&cross_col,&local_b4);
    ImVec2::ImVec2(&local_c4,-local_98,-local_98);
    local_bc = operator+((ImVec2 *)&cross_col,&local_c4);
    ImDrawList::AddLine(pIVar1,&local_ac,&local_bc,local_9c,1.0);
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b0);
    ImVec2::ImVec2(&local_d4,local_98,-local_98);
    local_cc = operator+((ImVec2 *)&cross_col,&local_d4);
    ImVec2::ImVec2(&local_e4,-local_98,local_98);
    local_dc = operator+((ImVec2 *)&cross_col,&local_e4);
    ImDrawList::AddLine(pIVar1,&local_cc,&local_dc,local_9c,1.0);
    pos_local._7_1_ = (bool)(center.y._0_1_ & 1);
  }
  return pos_local._7_1_;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Tweak 1: Shrink hit-testing area if button covers an abnormally large proportion of the visible region. That's in order to facilitate moving the window away. (#3825)
    // This may better be applied as a general hit-rect reduction mechanism for all widgets to ensure the area to move window is always accessible?
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ImRect bb_interact = bb;
    const float area_to_visible_ratio = window->OuterRectClipped.GetArea() / bb.GetArea();
    if (area_to_visible_ratio < 1.5f)
        bb_interact.Expand(ImFloor(bb_interact.GetSize() * -0.25f));

    // Tweak 2: We intentionally allow interaction when clipped so that a mechanical Alt,Right,Activate sequence can always close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    bool is_clipped = !ItemAdd(bb_interact, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb_interact, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    // FIXME: Clarify this mess
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, +cross_extent), center + ImVec2(-cross_extent, -cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, -cross_extent), center + ImVec2(-cross_extent, +cross_extent), cross_col, 1.0f);

    return pressed;
}